

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

BinaryOp wasm::Abstract::getBinary(Type type,Op op)

{
  BasicType BVar1;
  Type TStack_18;
  Op op_local;
  Type type_local;
  
  TStack_18.id = type.id;
  BVar1 = wasm::Type::getBasic(&stack0xffffffffffffffe8);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    type_local.id._4_4_ = InvalidBinary;
    break;
  case i32:
    switch(op) {
    case Add:
      type_local.id._4_4_ = AddInt32;
      break;
    case Sub:
      type_local.id._4_4_ = SubInt32;
      break;
    case Mul:
      type_local.id._4_4_ = MulInt32;
      break;
    case DivU:
      type_local.id._4_4_ = DivUInt32;
      break;
    case DivS:
      type_local.id._4_4_ = DivSInt32;
      break;
    case RemU:
      type_local.id._4_4_ = RemUInt32;
      break;
    case RemS:
      type_local.id._4_4_ = RemSInt32;
      break;
    case Shl:
      type_local.id._4_4_ = ShlInt32;
      break;
    case ShrU:
      type_local.id._4_4_ = ShrUInt32;
      break;
    case ShrS:
      type_local.id._4_4_ = ShrSInt32;
      break;
    case RotL:
      type_local.id._4_4_ = RotLInt32;
      break;
    case RotR:
      type_local.id._4_4_ = RotRInt32;
      break;
    case And:
      type_local.id._4_4_ = AndInt32;
      break;
    case Or:
      type_local.id._4_4_ = OrInt32;
      break;
    case Xor:
      type_local.id._4_4_ = XorInt32;
      break;
    default:
      type_local.id._4_4_ = InvalidBinary;
      break;
    case Eq:
      type_local.id._4_4_ = EqInt32;
      break;
    case Ne:
      type_local.id._4_4_ = NeInt32;
      break;
    case LtS:
      type_local.id._4_4_ = LtSInt32;
      break;
    case LtU:
      type_local.id._4_4_ = LtUInt32;
      break;
    case LeS:
      type_local.id._4_4_ = LeSInt32;
      break;
    case LeU:
      type_local.id._4_4_ = LeUInt32;
      break;
    case GtS:
      type_local.id._4_4_ = GtSInt32;
      break;
    case GtU:
      type_local.id._4_4_ = GtUInt32;
      break;
    case GeS:
      type_local.id._4_4_ = GeSInt32;
      break;
    case GeU:
      type_local.id._4_4_ = GeUInt32;
    }
    break;
  case i64:
    switch(op) {
    case Add:
      type_local.id._4_4_ = AddInt64;
      break;
    case Sub:
      type_local.id._4_4_ = SubInt64;
      break;
    case Mul:
      type_local.id._4_4_ = MulInt64;
      break;
    case DivU:
      type_local.id._4_4_ = DivUInt64;
      break;
    case DivS:
      type_local.id._4_4_ = DivSInt64;
      break;
    case RemU:
      type_local.id._4_4_ = RemUInt64;
      break;
    case RemS:
      type_local.id._4_4_ = RemSInt64;
      break;
    case Shl:
      type_local.id._4_4_ = ShlInt64;
      break;
    case ShrU:
      type_local.id._4_4_ = ShrUInt64;
      break;
    case ShrS:
      type_local.id._4_4_ = ShrSInt64;
      break;
    case RotL:
      type_local.id._4_4_ = RotLInt64;
      break;
    case RotR:
      type_local.id._4_4_ = RotRInt64;
      break;
    case And:
      type_local.id._4_4_ = AndInt64;
      break;
    case Or:
      type_local.id._4_4_ = OrInt64;
      break;
    case Xor:
      type_local.id._4_4_ = XorInt64;
      break;
    default:
      type_local.id._4_4_ = InvalidBinary;
      break;
    case Eq:
      type_local.id._4_4_ = EqInt64;
      break;
    case Ne:
      type_local.id._4_4_ = NeInt64;
      break;
    case LtS:
      type_local.id._4_4_ = LtSInt64;
      break;
    case LtU:
      type_local.id._4_4_ = LtUInt64;
      break;
    case LeS:
      type_local.id._4_4_ = LeSInt64;
      break;
    case LeU:
      type_local.id._4_4_ = LeUInt64;
      break;
    case GtS:
      type_local.id._4_4_ = GtSInt64;
      break;
    case GtU:
      type_local.id._4_4_ = GtUInt64;
      break;
    case GeS:
      type_local.id._4_4_ = GeSInt64;
      break;
    case GeU:
      type_local.id._4_4_ = GeUInt64;
    }
    break;
  case f32:
    switch(op) {
    case Add:
      type_local.id._4_4_ = AddFloat32;
      break;
    case Sub:
      type_local.id._4_4_ = SubFloat32;
      break;
    case Mul:
      type_local.id._4_4_ = MulFloat32;
      break;
    case DivU:
      type_local.id._4_4_ = DivFloat32;
      break;
    case DivS:
      type_local.id._4_4_ = DivFloat32;
      break;
    default:
      type_local.id._4_4_ = InvalidBinary;
      break;
    case CopySign:
      type_local.id._4_4_ = CopySignFloat32;
      break;
    case Eq:
      type_local.id._4_4_ = EqFloat32;
      break;
    case Ne:
      type_local.id._4_4_ = NeFloat32;
    }
    break;
  case f64:
    switch(op) {
    case Add:
      type_local.id._4_4_ = AddFloat64;
      break;
    case Sub:
      type_local.id._4_4_ = SubFloat64;
      break;
    case Mul:
      type_local.id._4_4_ = MulFloat64;
      break;
    case DivU:
      type_local.id._4_4_ = DivFloat64;
      break;
    case DivS:
      type_local.id._4_4_ = DivFloat64;
      break;
    default:
      type_local.id._4_4_ = InvalidBinary;
      break;
    case CopySign:
      type_local.id._4_4_ = CopySignFloat64;
      break;
    case Eq:
      type_local.id._4_4_ = EqFloat64;
      break;
    case Ne:
      type_local.id._4_4_ = NeFloat64;
    }
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/abstract.h"
                       ,0x130);
  }
  return type_local.id._4_4_;
}

Assistant:

inline BinaryOp getBinary(Type type, Op op) {
  switch (type.getBasic()) {
    case Type::i32: {
      switch (op) {
        case Add:
          return AddInt32;
        case Sub:
          return SubInt32;
        case Mul:
          return MulInt32;
        case DivU:
          return DivUInt32;
        case DivS:
          return DivSInt32;
        case RemU:
          return RemUInt32;
        case RemS:
          return RemSInt32;
        case Shl:
          return ShlInt32;
        case ShrU:
          return ShrUInt32;
        case ShrS:
          return ShrSInt32;
        case RotL:
          return RotLInt32;
        case RotR:
          return RotRInt32;
        case And:
          return AndInt32;
        case Or:
          return OrInt32;
        case Xor:
          return XorInt32;
        case Eq:
          return EqInt32;
        case Ne:
          return NeInt32;
        case LtS:
          return LtSInt32;
        case LtU:
          return LtUInt32;
        case LeS:
          return LeSInt32;
        case LeU:
          return LeUInt32;
        case GtS:
          return GtSInt32;
        case GtU:
          return GtUInt32;
        case GeS:
          return GeSInt32;
        case GeU:
          return GeUInt32;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::i64: {
      switch (op) {
        case Add:
          return AddInt64;
        case Sub:
          return SubInt64;
        case Mul:
          return MulInt64;
        case DivU:
          return DivUInt64;
        case DivS:
          return DivSInt64;
        case RemU:
          return RemUInt64;
        case RemS:
          return RemSInt64;
        case Shl:
          return ShlInt64;
        case ShrU:
          return ShrUInt64;
        case ShrS:
          return ShrSInt64;
        case RotL:
          return RotLInt64;
        case RotR:
          return RotRInt64;
        case And:
          return AndInt64;
        case Or:
          return OrInt64;
        case Xor:
          return XorInt64;
        case Eq:
          return EqInt64;
        case Ne:
          return NeInt64;
        case LtS:
          return LtSInt64;
        case LtU:
          return LtUInt64;
        case LeS:
          return LeSInt64;
        case LeU:
          return LeUInt64;
        case GtS:
          return GtSInt64;
        case GtU:
          return GtUInt64;
        case GeS:
          return GeSInt64;
        case GeU:
          return GeUInt64;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::f32: {
      switch (op) {
        case Add:
          return AddFloat32;
        case Sub:
          return SubFloat32;
        case Mul:
          return MulFloat32;
        case DivU:
          return DivFloat32;
        case DivS:
          return DivFloat32;
        case CopySign:
          return CopySignFloat32;
        case Eq:
          return EqFloat32;
        case Ne:
          return NeFloat32;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::f64: {
      switch (op) {
        case Add:
          return AddFloat64;
        case Sub:
          return SubFloat64;
        case Mul:
          return MulFloat64;
        case DivU:
          return DivFloat64;
        case DivS:
          return DivFloat64;
        case CopySign:
          return CopySignFloat64;
        case Eq:
          return EqFloat64;
        case Ne:
          return NeFloat64;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::v128:
    case Type::none:
    case Type::unreachable: {
      return InvalidBinary;
    }
  }
  WASM_UNREACHABLE("invalid type");
}